

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

bool __thiscall libcellml::Units::removeUnit(Units *this,string *reference)

{
  EntityImpl *pEVar1;
  UnitDefinition *pUVar2;
  const_iterator __position;
  
  __position = UnitsImpl::findUnit((UnitsImpl *)
                                   (this->super_NamedEntity).super_ParentedEntity.super_Entity.
                                   mPimpl,reference);
  pEVar1 = (this->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl;
  pUVar2 = *(UnitDefinition **)((long)&pEVar1[2].mId.field_2 + 8);
  if (__position._M_current != pUVar2) {
    std::vector<libcellml::UnitDefinition,_std::allocator<libcellml::UnitDefinition>_>::erase
              ((vector<libcellml::UnitDefinition,_std::allocator<libcellml::UnitDefinition>_> *)
               &pEVar1[2].mId.field_2,__position);
  }
  return __position._M_current != pUVar2;
}

Assistant:

bool Units::removeUnit(const std::string &reference)
{
    bool status = false;
    auto result = pFunc()->findUnit(reference);
    if (result != pFunc()->mUnitDefinitions.end()) {
        pFunc()->mUnitDefinitions.erase(result);
        status = true;
    }

    return status;
}